

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

void install_signal(int sig)

{
  int in_EDI;
  sigaction sigact;
  int ret;
  sigaction local_a0;
  int local_8;
  int local_4;
  
  local_4 = in_EDI;
  memcpy(&local_a0,&PTR_sighandler_00109d40,0x98);
  sigfillset(&local_a0.sa_mask);
  local_8 = sigaction(local_4,&local_a0,(sigaction *)0x0);
  if (local_8 < 0) {
    err(1,"sigaction for signal %i",local_4);
  }
  return;
}

Assistant:

static void install_signal(int sig)
{
	int ret;
	struct sigaction sigact = {
		.sa_sigaction = sighandler,
		.sa_flags = SA_SIGINFO,
	};

	sigfillset(&sigact.sa_mask);
	ret = sigaction(sig, &sigact, NULL);
	if (ret < 0)
		err(1, "sigaction for signal %i", sig);
}